

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

uint __thiscall
Inline::HandleDifferentTypesSameFunction
          (Inline *this,FixedFieldInfo *fixedFunctionInfoArray,uint16 cachedFixedInlineeCount)

{
  FixedFieldIDL *this_00;
  intptr_t iVar1;
  intptr_t iVar2;
  undefined2 in_register_00000012;
  ushort uVar3;
  FixedFieldInfo *this_01;
  FixedFieldIDL *pFVar4;
  void *pvVar5;
  undefined1 local_b0 [8];
  FixedFieldInfo tmpInfo;
  uint local_38;
  
  local_38 = CONCAT22(in_register_00000012,cachedFixedInlineeCount);
  tmpInfo.m_data.environmentAddr.ptr = (void *)(ulong)local_38;
  uVar3 = 0;
LAB_00502637:
  if (cachedFixedInlineeCount <= uVar3) {
    return local_38 & 0xffff;
  }
  pvVar5 = (void *)(ulong)uVar3;
  this_01 = fixedFunctionInfoArray + (long)pvVar5;
  do {
    uVar3 = uVar3 + 1;
    pFVar4 = &fixedFunctionInfoArray[(long)pvVar5].m_data;
    do {
      pvVar5 = (void *)((long)pvVar5 + 1);
      this_00 = pFVar4 + 1;
      if (tmpInfo.m_data.environmentAddr.ptr <= pvVar5) goto LAB_00502637;
      iVar1 = FixedFieldInfo::GetFieldValue(this_01);
      iVar2 = FixedFieldInfo::GetFieldValue((FixedFieldInfo *)(pFVar4 + 1));
      pFVar4 = this_00;
    } while (iVar1 != iVar2);
    FixedFieldIDL::FixedFieldIDL((FixedFieldIDL *)local_b0,this_00);
    FixedFieldIDL::operator=(this_00,&fixedFunctionInfoArray[uVar3].m_data);
    FixedFieldIDL::operator=(&fixedFunctionInfoArray[uVar3].m_data,(FixedFieldIDL *)local_b0);
    FixedFieldInfo::SetNextHasSameFixedField(fixedFunctionInfoArray + ((ulong)uVar3 - 1));
    local_38 = local_38 - 1;
  } while( true );
}

Assistant:

uint
Inline::HandleDifferentTypesSameFunction(__inout_ecount(cachedFixedInlineeCount) FixedFieldInfo* fixedFunctionInfoArray, uint16 cachedFixedInlineeCount)
{
    uint16 uniqueCount = cachedFixedInlineeCount;
    uint16 swapIndex;
    for (uint16 i = 0; i < cachedFixedInlineeCount; i++)
    {
        swapIndex = i+1;
        for (uint16 j = i+1; j < cachedFixedInlineeCount; j++)
        {
            if (fixedFunctionInfoArray[i].GetFieldValue() == fixedFunctionInfoArray[j].GetFieldValue())
            {
                FixedFieldInfo tmpInfo = fixedFunctionInfoArray[j];
                fixedFunctionInfoArray[j] = fixedFunctionInfoArray[swapIndex];
                fixedFunctionInfoArray[swapIndex] = tmpInfo;
                fixedFunctionInfoArray[swapIndex - 1].SetNextHasSameFixedField();
                swapIndex++;
                uniqueCount--;
            }
        }
        i = swapIndex-1;
    }
    return uniqueCount;
}